

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonRewrite.c
# Opt level: O2

int main(int ArgC,char **ArgV)

{
  char *__filename;
  bool bVar1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  _Bool _Var6;
  _Bool _Var7;
  _Bool _Var8;
  _Bool _Var9;
  _Bool _Var10;
  uint uVar11;
  JL_STATUS JVar12;
  FILE *__stream;
  long lVar13;
  char *JsonString;
  size_t sVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  JlDataObject *jsonObject;
  char *outputJsonString;
  size_t errorAtPos;
  int ArgC_local;
  char **ArgV_local;
  
  ArgC_local = ArgC;
  ArgV_local = ArgV;
  _Var2 = ParseCommandLineBoolArg(&ArgC_local,&ArgV_local,"-a","--ascii");
  _Var3 = ParseCommandLineBoolArg(&ArgC_local,&ArgV_local,"-i","--indent");
  _Var4 = ParseCommandLineBoolArg(&ArgC_local,&ArgV_local,"-x","--hex");
  _Var5 = ParseCommandLineBoolArg(&ArgC_local,&ArgV_local,"-c","--comma");
  _Var6 = ParseCommandLineBoolArg(&ArgC_local,&ArgV_local,"-b","--bare");
  _Var7 = ParseCommandLineBoolArg(&ArgC_local,&ArgV_local,"-s","--singlequote");
  _Var8 = ParseCommandLineBoolArg(&ArgC_local,&ArgV_local,"-5","--json5");
  _Var9 = ParseCommandLineBoolArg(&ArgC_local,&ArgV_local,"-h","--help");
  _Var10 = ParseCommandLineBoolArg(&ArgC_local,&ArgV_local,"/h","/?");
  if (((ArgC_local != 2) || (_Var9)) || (_Var10)) {
    puts(
        "Syntax:\n  JsonRewrite [options] <JsonFile>\n   options:\n       -a, --ascii       - Escape all non ascii in output\n       -i, --indent      - Apply indent formatting to output\n       -x, --hex         - Allow hex in output (Json5)\n       -b, --bare        - Allow bare keywords in dictionaries (Json5)\n       -s, --singlequote - Use single quotes instead od doubles for strings (Json5)\n       -c, --comma       - Put in trailing commas (Json5)\n       -5, --json5       - Combines --hex --bare --singlequote\n"
        );
    return 1;
  }
  __filename = ArgV[1];
  uVar15 = 0x2c;
  if (!_Var8) {
    uVar15 = 0;
  }
  __stream = fopen(__filename,"rt");
  if (__stream == (FILE *)0x0) goto LAB_001014b6;
  fseek(__stream,0,2);
  lVar13 = ftell(__stream);
  fseek(__stream,0,0);
  uVar17 = (uint)lVar13;
  if (((int)uVar17 < 1) ||
     (JsonString = (char *)malloc((ulong)(uVar17 + 1)), JsonString == (char *)0x0)) {
LAB_0010146a:
    JsonString = (char *)0x0;
    bVar1 = false;
  }
  else {
    sVar14 = fread(JsonString,1,(ulong)(uVar17 & 0x7fffffff),__stream);
    uVar11 = (uint)sVar14;
    if ((int)uVar11 < 1 || (int)uVar17 < (int)uVar11) goto LAB_0010146a;
    JsonString[uVar11 & 0x7fffffff] = '\0';
    bVar1 = true;
  }
  fclose(__stream);
  if (bVar1) {
    errorAtPos = 0;
    jsonObject = (JlDataObject *)0x0;
    JVar12 = JlParseJson(JsonString,&jsonObject,&errorAtPos);
    if (JVar12 == JL_STATUS_SUCCESS) {
      outputJsonString = (char *)0x0;
      JVar12 = JlOutputJsonEx(jsonObject,
                              ((ulong)_Var5 << 4 |
                              (ulong)_Var4 << 5 | (ulong)_Var2 + (ulong)_Var3 * 2) +
                              (ulong)_Var6 * 4 + (ulong)_Var7 * 8 | uVar15,&outputJsonString);
      if (JVar12 == JL_STATUS_SUCCESS) {
        iVar16 = 0;
        printf("%s",outputJsonString);
        JlFreeJsonStringBuffer(&outputJsonString);
      }
      else {
        puts("Failed to output json");
        iVar16 = 4;
      }
      JlFreeObjectTree(&jsonObject);
    }
    else {
      printf("Failed to parse json in file: %s Position: %u\n",__filename,errorAtPos & 0xffffffff);
      iVar16 = 3;
    }
    free(JsonString);
    return iVar16;
  }
LAB_001014b6:
  printf("Failed to read file: %s\n",__filename);
  return 2;
}

Assistant:

int
main
    (
        int     ArgC,
        char**  ArgV
    )
{
    int result = 0;

    bool outputAscii = ParseCommandLineBoolArg( &ArgC, &ArgV, "-a", "--ascii" );
    bool outputIndent = ParseCommandLineBoolArg( &ArgC, &ArgV, "-i", "--indent" );
    bool outputHex = ParseCommandLineBoolArg( &ArgC, &ArgV, "-x", "--hex" );
    bool outputComma = ParseCommandLineBoolArg( &ArgC, &ArgV, "-c", "--comma" );
    bool outputBare = ParseCommandLineBoolArg( &ArgC, &ArgV, "-b", "--bare" );
    bool outputSingleQuote = ParseCommandLineBoolArg( &ArgC, &ArgV, "-s", "--singlequote" );
    bool outputJson5 = ParseCommandLineBoolArg( &ArgC, &ArgV, "-5", "--json5" );
    bool help = ParseCommandLineBoolArg( &ArgC, &ArgV, "-h", "--help" );
    help |= ParseCommandLineBoolArg( &ArgC, &ArgV, "/h", "/?" );

    if( 2 != ArgC || help )
    {
        printf(
            "Syntax:\n"
            "  JsonRewrite [options] <JsonFile>\n"
            "   options:\n"
            "       -a, --ascii       - Escape all non ascii in output\n"
            "       -i, --indent      - Apply indent formatting to output\n"
            "       -x, --hex         - Allow hex in output (Json5)\n"
            "       -b, --bare        - Allow bare keywords in dictionaries (Json5)\n"
            "       -s, --singlequote - Use single quotes instead od doubles for strings (Json5)\n"
            "       -c, --comma       - Put in trailing commas (Json5)\n"
            "       -5, --json5       - Combines --hex --bare --singlequote\n"
            "\n" );
        result = 1;
    }
    else
    {
        char const* inputFilename = ArgV[1];
        bool success;
        char* inputJsonString = NULL;

        // Create output option flags.
        JL_OUTPUT_FLAGS outputFlags =
                ( outputAscii ? JL_OUTPUT_FLAGS_ASCII : 0 )
            |   ( outputIndent ? JL_OUTPUT_FLAGS_INDENT : 0 )
            |   ( outputHex ? JL_OUTPUT_FLAGS_J5_ALLOW_HEX : 0 )
            |   ( outputComma ? JL_OUTPUT_FLAGS_J5_TRAILING_COMMAS : 0 )
            |   ( outputBare ? JL_OUTPUT_FLAGS_J5_USE_BARE_KEYWORDS : 0 )
            |   ( outputSingleQuote ? JL_OUTPUT_FLAGS_J5_SINGLE_QUOTES : 0 )
            |   ( outputJson5 ? JL_OUTPUT_FLAGS_JSON5 : 0 );

        success = ReadFileIntoMemory( inputFilename, &inputJsonString );
        if( success )
        {
            JL_STATUS jlStatus;
            size_t errorAtPos = 0;
            JlDataObject* jsonObject = NULL;

            jlStatus = JlParseJson( inputJsonString, &jsonObject, &errorAtPos );
            if( JL_STATUS_SUCCESS == jlStatus )
            {
                char* outputJsonString = NULL;
                jlStatus = JlOutputJsonEx( jsonObject, outputFlags, &outputJsonString );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    // Print out the new formatted Json.
                    printf( "%s", outputJsonString );

                    JlFreeJsonStringBuffer( &outputJsonString );
                }
                else
                {
                    printf( "Failed to output json\n" );
                    result = 4;
                }

                JlFreeObjectTree( &jsonObject );
            }
            else
            {
                printf( "Failed to parse json in file: %s Position: %u\n", inputFilename, (uint32_t)errorAtPos );
                result = 3;
            }

            free( inputJsonString );
        }
        else
        {
            printf( "Failed to read file: %s\n", inputFilename );
            result = 2;
        }

    }

    return result;
}